

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

char * google::protobuf::FastInt32ToBufferLeft(int32 i,char *buffer)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  
  if (i < 0) {
    *buffer = '-';
    pcVar1 = FastUInt32ToBufferLeft(-i,buffer + 1);
    return pcVar1;
  }
  if ((uint)i < 1000000000) {
    if (99 < (uint)i) {
      if (9999 < (uint)i) {
        if (999999 < (uint)i) {
          if (99999999 < (uint)i) {
            uVar3 = (ulong)(uint)i / 100000000;
            *buffer = (byte)((uint)i / 100000000) | 0x30;
            buffer = buffer + 1;
            goto LAB_002c56c5;
          }
          if (9999999 < (uint)i) goto LAB_002c56cd;
          uVar3 = (ulong)(uint)i / 1000000;
          *buffer = (char)((uint)i / 1000000) + '0';
          buffer = buffer + 1;
          goto LAB_002c56ec;
        }
        if (99999 < (uint)i) goto LAB_002c56f4;
        uVar3 = (ulong)(uint)i / 10000;
        *buffer = (byte)((uint)i / 10000) | 0x30;
        buffer = buffer + 1;
        goto LAB_002c5715;
      }
      if (999 < (uint)i) goto LAB_002c571d;
      uVar2 = (i & 0xffffU) / 100;
      uVar3 = (ulong)uVar2;
      *buffer = (byte)uVar2 | 0x30;
      buffer = buffer + 1;
      goto LAB_002c573c;
    }
    if ((uint)i < 10) {
      *buffer = (byte)i | 0x30;
      pcVar1 = buffer + 1;
      goto LAB_002c5755;
    }
  }
  else {
    uVar3 = (ulong)(uint)i / 100000000;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar3 * 2);
    buffer = buffer + 2;
LAB_002c56c5:
    i = i + (int)uVar3 * -100000000;
LAB_002c56cd:
    uVar3 = (ulong)(uint)i / 1000000;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar3 * 2);
    buffer = buffer + 2;
LAB_002c56ec:
    i = i + (int)uVar3 * -1000000;
LAB_002c56f4:
    uVar3 = (ulong)(uint)i / 10000;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar3 * 2);
    buffer = buffer + 2;
LAB_002c5715:
    i = i + (int)uVar3 * -10000;
LAB_002c571d:
    uVar3 = (ulong)(uint)i / 100;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar3 * 2);
    buffer = buffer + 2;
LAB_002c573c:
    i = i + (int)uVar3 * -100;
  }
  *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + (ulong)(uint)i * 2);
  pcVar1 = buffer + 2;
LAB_002c5755:
  *pcVar1 = '\0';
  return pcVar1;
}

Assistant:

char* FastInt32ToBufferLeft(int32 i, char* buffer) {
  uint32 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt32ToBufferLeft(u, buffer);
}